

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEnumVal.cpp
# Opt level: O0

void usage(void)

{
  ostream *this;
  
  this = std::operator<<((ostream *)&std::cout,
                         "\nUsage:\n    SEnumVal <XML file>\n\nThis program parses a file, then shows how to enumerate the\ncontents of the Schema Grammar. Essentially, shows how one can\naccess the Schema information stored in internal data structures.\n"
                        );
  std::ostream::operator<<((ostream *)this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void usage()
{
    std::cout << "\nUsage:\n"
            "    SEnumVal <XML file>\n\n"
            "This program parses a file, then shows how to enumerate the\n"
            "contents of the Schema Grammar. Essentially, shows how one can\n"
            "access the Schema information stored in internal data structures.\n"
         << std::endl;
}